

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fst.h
# Opt level: O1

void __thiscall
PDA::Transducer::BasicFst<wchar_t>::Vertex::
Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
          (Vertex *this,pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *first,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_1)

{
  (this->m_transitions).
  super__List_base<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>,_std::allocator<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->m_transitions).
  super__List_base<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>,_std::allocator<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->m_transitions).
  super__List_base<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>,_std::allocator<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->m_action).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_action).super__Function_base._M_functor + 8) = 0;
  (this->m_action).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_action)._M_invoker = (_Invoker_type)0x0;
  addTransition<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (this,first,rest,rest_1);
  return;
}

Assistant:

Vertex (const First &first, const Rest&... rest)
        {
            addTransition(first, rest...);
        }